

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

bool __thiscall
iDynTree::InverseKinematics::addPositionTarget
          (InverseKinematics *this,string *frameName,MatrixView<const_double> *targetValue,
          double positionWeight)

{
  index_type iVar1;
  MatrixView<const_double> *in_RDX;
  MatrixView<const_double> *in_RSI;
  bool ok;
  int expected_transform_rows;
  int expected_transform_cols;
  MatrixView<const_double> *in_stack_fffffffffffffe88;
  MatrixView<const_double> *this_00;
  bool local_149;
  MatrixView<const_double> *in_stack_fffffffffffffeb8;
  MatrixFixSize<4U,_4U> *in_stack_fffffffffffffec0;
  MatrixFixSize local_118 [128];
  Transform local_98 [103];
  bool local_31;
  undefined4 local_30;
  undefined4 local_2c;
  MatrixView<const_double> *local_18;
  bool local_1;
  
  local_2c = 4;
  local_30 = 4;
  this_00 = in_RDX;
  local_18 = in_RSI;
  iVar1 = MatrixView<const_double>::rows(in_RDX);
  local_149 = false;
  if (iVar1 == 4) {
    iVar1 = MatrixView<const_double>::cols(this_00);
    local_149 = iVar1 == 4;
  }
  local_31 = local_149;
  if (local_149 == false) {
    iDynTree::reportError("InverseKinematics","addPositionTarget","Wrong size in input targetValue")
    ;
    local_1 = false;
  }
  else {
    MatrixView<const_double>::MatrixView(local_18,in_stack_fffffffffffffe88);
    MatrixFixSize<4U,_4U>::MatrixFixSize(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    iDynTree::Transform::Transform(local_98,local_118);
    local_1 = addPositionTarget((InverseKinematics *)this_00,(string *)in_RDX,(Transform *)local_18,
                                (double)in_stack_fffffffffffffe88);
  }
  return local_1;
}

Assistant:

bool InverseKinematics::addPositionTarget(const std::string& frameName,
                                              iDynTree::MatrixView<const double> targetValue,
                                              const double positionWeight)
    {
        constexpr int expected_transform_cols = 4;
        constexpr int expected_transform_rows = 4;
        bool ok = (targetValue.rows() == expected_transform_rows)
                  && (targetValue.cols() == expected_transform_cols);
        if (!ok)
        {
            reportError("InverseKinematics",
                        "addPositionTarget",
                        "Wrong size in input targetValue");
            return false;
        }

        return this->addPositionTarget(frameName, Transform(targetValue), positionWeight);
    }